

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Utilities.h
# Opt level: O3

void __thiscall
soul::heart::Utilities::
GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>
::checkAndThrowErrorIfCycleFound
          (GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>
           *this)

{
  pointer pNVar1;
  Context *in_RCX;
  pointer this_00;
  vector<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*,_std::allocator<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*>_>
  visitedStack;
  undefined1 local_58 [40];
  uint64_t uStack_30;
  uint64_t local_28;
  
  local_58._0_8_ = (ProcessorInstance *)0x0;
  local_58._8_8_ = (ProcessorInstance *)0x0;
  local_58._16_8_ = (pointer)0x0;
  std::
  vector<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*,_std::allocator<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*>_>
  ::reserve((vector<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*,_std::allocator<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*>_>
             *)local_58,0x100);
  this_00 = (this->nodes).
            super__Vector_base<soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node,_std::allocator<soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pNVar1 = (this->nodes).
           super__Vector_base<soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node,_std::allocator<soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != pNVar1) {
    do {
      local_58._32_8_ = (SourceCodeText *)0x0;
      uStack_30 = 0;
      local_28 = 0;
      check((GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>
             *)this_00,(Node *)local_58,
            (vector<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*,_std::allocator<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*>_>
             *)(local_58 + 0x20),in_RCX);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)local_58._32_8_);
      if (local_58._0_8_ != local_58._8_8_) {
        throwInternalCompilerError("visitedStack.empty()","checkAndThrowErrorIfCycleFound",0x186);
      }
      this_00 = this_00 + 1;
    } while (this_00 != pNVar1);
  }
  if ((ProcessorInstance *)local_58._0_8_ != (ProcessorInstance *)0x0) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ - local_58._0_8_);
  }
  return;
}

Assistant:

void checkAndThrowErrorIfCycleFound() const
        {
            std::vector<const Node*> visitedStack;
            visitedStack.reserve (256);

            for (auto& n : nodes)
            {
                check (n, visitedStack, {});
                SOUL_ASSERT (visitedStack.empty());
            }
        }